

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_aggregate_expression.cpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BoundAggregateExpression::Deserialize
          (BoundAggregateExpression *this,Deserializer *deserializer)

{
  _Head_base<0UL,_duckdb::BoundAggregateExpression_*,_false> _Var1;
  AggregateType AVar2;
  bool bVar3;
  int iVar4;
  pointer pBVar5;
  ClientContext *context;
  byte bVar6;
  _Head_base<0UL,_duckdb::BoundOrderModifier_*,_false> _Var7;
  LogicalType *in_R9;
  AggregateType aggregate_type;
  templated_unique_single_t result;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> filter;
  LogicalType return_type;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  children;
  string str;
  pair<duckdb::AggregateFunction,_duckdb::unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>_>
  entry;
  AggregateType local_1e1;
  _Head_base<0UL,_duckdb::BoundAggregateExpression_*,_false> local_1e0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_1d8;
  _Head_base<0UL,_duckdb::BoundAggregateExpression_*,_false> local_1d0;
  LogicalType local_1c8;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_1b0;
  undefined1 local_198 [32];
  LogicalType local_178;
  pair<duckdb::AggregateFunction,_duckdb::unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>_>
  local_160;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,200,"return_type");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  LogicalType::Deserialize(&local_1c8,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xc9,"children");
  Deserializer::
  Read<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
            ((type *)&local_1b0,deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  LogicalType::LogicalType(&local_178,&local_1c8);
  FunctionSerializer::Deserialize<duckdb::AggregateFunction,duckdb::AggregateFunctionCatalogEntry>
            (&local_160,(FunctionSerializer *)deserializer,(Deserializer *)0x1b,
             (CatalogType)&local_1b0,
             (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              *)&local_178,in_R9);
  LogicalType::~LogicalType(&local_178);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xcb,"aggregate_type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(local_198,deserializer);
    AVar2 = EnumUtil::FromString<duckdb::AggregateType>((char *)local_198._0_8_);
    if ((Expression *)local_198._0_8_ != (Expression *)(local_198 + 0x10)) {
      operator_delete((void *)local_198._0_8_);
    }
  }
  else {
    iVar4 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    AVar2 = (AggregateType)iVar4;
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  local_1e1 = AVar2;
  iVar4 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcc,"filter");
  if ((char)iVar4 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_1d8._M_head_impl = (Expression *)0x0;
  }
  else {
    local_1d8._M_head_impl = (Expression *)0x0;
    iVar4 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar4 != '\0') {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      Expression::Deserialize((Expression *)local_198,deserializer);
      local_1d8._M_head_impl = (Expression *)local_198._0_8_;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  make_uniq<duckdb::BoundAggregateExpression,duckdb::AggregateFunction,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>,duckdb::AggregateType&>
            ((duckdb *)&local_1e0,&local_160.first,
             (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              *)&local_1b0,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_1d8,&local_160.second,&local_1e1);
  pBVar5 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                         *)&local_1e0);
  bVar3 = LogicalType::operator==(&(pBVar5->super_Expression).return_type,&local_1c8);
  if (!bVar3) {
    context = Deserializer::Get<duckdb::ClientContext&>(deserializer);
    local_1d0._M_head_impl = local_1e0._M_head_impl;
    local_1e0._M_head_impl = (BoundAggregateExpression *)0x0;
    BoundCastExpression::AddCastToType
              ((BoundCastExpression *)this,context,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_1d0,&local_1c8,false);
    if (local_1d0._M_head_impl != (BoundAggregateExpression *)0x0) {
      (*((local_1d0._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])()
      ;
    }
    local_1d0._M_head_impl = (BoundAggregateExpression *)0x0;
    goto LAB_00d7d443;
  }
  pBVar5 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                         *)&local_1e0);
  iVar4 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcd,"order_bys");
  bVar6 = (byte)iVar4;
  if (bVar6 == 0) {
    _Var7._M_head_impl =
         (pBVar5->order_bys).
         super_unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::BoundOrderModifier_*,_std::default_delete<duckdb::BoundOrderModifier>_>
         .super__Head_base<0UL,_duckdb::BoundOrderModifier_*,_false>._M_head_impl;
    (pBVar5->order_bys).
    super_unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::BoundOrderModifier_*,_std::default_delete<duckdb::BoundOrderModifier>_>
    .super__Head_base<0UL,_duckdb::BoundOrderModifier_*,_false>._M_head_impl =
         (BoundOrderModifier *)0x0;
    if (_Var7._M_head_impl != (BoundOrderModifier *)0x0) goto LAB_00d7d41a;
    bVar6 = 0;
  }
  else {
    iVar4 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar4 == '\0') {
      local_198._0_8_ = (BoundOrderModifier *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      BoundOrderModifier::Deserialize((BoundOrderModifier *)local_198,deserializer);
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var7._M_head_impl =
         (pBVar5->order_bys).
         super_unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::BoundOrderModifier_*,_std::default_delete<duckdb::BoundOrderModifier>_>
         .super__Head_base<0UL,_duckdb::BoundOrderModifier_*,_false>._M_head_impl;
    (pBVar5->order_bys).
    super_unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::BoundOrderModifier_*,_std::default_delete<duckdb::BoundOrderModifier>_>
    .super__Head_base<0UL,_duckdb::BoundOrderModifier_*,_false>._M_head_impl =
         (BoundOrderModifier *)local_198._0_8_;
    if (_Var7._M_head_impl == (BoundOrderModifier *)0x0) {
      bVar6 = 1;
    }
    else {
LAB_00d7d41a:
      (*((_Var7._M_head_impl)->super_BoundResultModifier)._vptr_BoundResultModifier[1])();
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)bVar6);
  _Var1._M_head_impl = local_1e0._M_head_impl;
  local_1e0._M_head_impl = (BoundAggregateExpression *)0x0;
  (this->super_Expression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)_Var1._M_head_impl;
LAB_00d7d443:
  if (local_1e0._M_head_impl != (BoundAggregateExpression *)0x0) {
    (*((local_1e0._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])();
  }
  if (local_1d8._M_head_impl != (Expression *)0x0) {
    (*((local_1d8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  if ((__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
      local_160.second.
      super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
      super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
      super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)0x0) {
    (*(*(_func_int ***)
        local_160.second.
        super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
        super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t
        .super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
        super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl)[1])();
  }
  local_160.second.
  super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
  super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
  super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
       (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
       (__uniq_ptr_data<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true,_true>
       )0x0;
  local_160.first.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_02476990;
  if (local_160.first.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_160.first.function_info.internal.
               super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)&local_160);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector(&local_1b0);
  LogicalType::~LogicalType(&local_1c8);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> BoundAggregateExpression::Deserialize(Deserializer &deserializer) {
	auto return_type = deserializer.ReadProperty<LogicalType>(200, "return_type");
	auto children = deserializer.ReadProperty<vector<unique_ptr<Expression>>>(201, "children");
	auto entry = FunctionSerializer::Deserialize<AggregateFunction, AggregateFunctionCatalogEntry>(
	    deserializer, CatalogType::AGGREGATE_FUNCTION_ENTRY, children, return_type);
	auto aggregate_type = deserializer.ReadProperty<AggregateType>(203, "aggregate_type");
	auto filter =
	    deserializer.ReadPropertyWithExplicitDefault<unique_ptr<Expression>>(204, "filter", unique_ptr<Expression>());
	auto result = make_uniq<BoundAggregateExpression>(std::move(entry.first), std::move(children), std::move(filter),
	                                                  std::move(entry.second), aggregate_type);
	if (result->return_type != return_type) {
		// return type mismatch - push a cast
		auto &context = deserializer.Get<ClientContext &>();
		return BoundCastExpression::AddCastToType(context, std::move(result), return_type);
	}
	deserializer.ReadPropertyWithExplicitDefault(205, "order_bys", result->order_bys, unique_ptr<BoundOrderModifier>());
	return std::move(result);
}